

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceTexture::RunIteration
          (BasicResourceTexture *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  GLsizei GVar1;
  GLsizei GVar2;
  bool bVar3;
  GLuint GVar4;
  GLint location;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int width;
  reference pvVar11;
  float *pfVar12;
  uint *data;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  uint local_10c;
  GLuint index;
  Vector<float,_4> local_f8;
  GLuint local_e8;
  allocator<tcu::Vector<float,_4>_> local_e1;
  GLuint fbo;
  undefined1 local_d0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texture_data;
  undefined1 local_b0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_data;
  GLint kDepth;
  GLint kHeight;
  GLint kWidth;
  GLuint kBufferSize;
  char name [32];
  uint local_60;
  int i;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceTexture *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  gl4cts::(anonymous_namespace)::BasicResourceTexture::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar4;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar3) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    for (local_60 = 0; (int)local_60 < 9; local_60 = local_60 + 1) {
      sprintf((char *)&kWidth,"g_sampler%d",(ulong)local_60);
      location = glu::CallLogWrapper::glGetUniformLocation
                           (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                             super_CallLogWrapper,this->m_program,(GLchar *)&kWidth);
      glu::CallLogWrapper::glUniform1i
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,location,local_60);
    }
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    uVar5 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    uVar7 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    uVar9 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar10 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    uVar10 = uVar5 * uVar6 * uVar7 * uVar8 * uVar9 * uVar10;
    uVar5 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    width = uVar5 * uVar6;
    uVar5 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    buffer_data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar5 * uVar6;
    uVar5 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    buffer_data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = uVar5 * uVar6;
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&texture_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_b0,
               (ulong)(uVar10 * 9),this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&texture_data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_b0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,(ulong)uVar10 * 0x90,pvVar11,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,123.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_e1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0,
               (ulong)uVar10,(value_type *)&fbo,&local_e1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_e1);
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,9,this->m_texture);
    }
    if (this->m_texture_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_texture_buffer);
    }
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde0,this->m_texture[0]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde0,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde0,0x2800,0x2600);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage1D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde0,0,0x8814,width,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2800,0x2600);
    GVar1 = buffer_data.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8814,width,GVar1,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c2);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x806f,this->m_texture[2]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x806f,0x2800,0x2600);
    GVar2 = buffer_data.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    GVar1 = (int)buffer_data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage3D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x806f,0,0x8814,width,GVar2,GVar1,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c3);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84f5,this->m_texture[3]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84f5,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84f5,0x2800,0x2600);
    GVar1 = buffer_data.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84f5,0,0x8814,width,GVar1,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c4);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c18,this->m_texture[4]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c18,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c18,0x2800,0x2600);
    GVar1 = buffer_data.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c18,0,0x8814,width,GVar1,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c5);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,this->m_texture[5]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,0x2800,0x2600);
    GVar2 = buffer_data.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    GVar1 = (int)buffer_data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glTexImage3D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,0,0x8814,width,GVar2,GVar1,0,0x1908,0x1406,pvVar11);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c6);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture_buffer);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_d0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,(ulong)uVar10 << 4,pvVar11,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_texture[6]);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8814,this->m_texture_buffer);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c7);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x9100,this->m_texture[7]);
    glu::CallLogWrapper::glTexImage2DMultisample
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x9100,4,0x8814,width,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,'\0');
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c8);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x9102,this->m_texture[8]);
    glu::CallLogWrapper::glTexImage3DMultisample
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x9102,4,0x8814,width,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
               (int)buffer_data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,'\0');
    glu::CallLogWrapper::glGenFramebuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&local_e8);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8d40,local_e8);
    glu::CallLogWrapper::glFramebufferTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8d40,0x8ce0,this->m_texture[7],0);
    tcu::Vector<float,_4>::Vector(&local_f8,123.0);
    pfVar12 = tcu::Vector<float,_4>::operator[](&local_f8,0);
    glu::CallLogWrapper::glClearBufferfv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,0,pfVar12);
    glu::CallLogWrapper::glFramebufferTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8d40,0x8ce0,this->m_texture[8],0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffef8,123.0);
    pfVar12 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&stack0xfffffffffffffef8,0);
    glu::CallLogWrapper::glClearBufferfv
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x1800,0,pfVar12);
    glu::CallLogWrapper::glDeleteFramebuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&local_e8);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar5 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar7 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar5,uVar6,uVar7);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      data = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,data,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_b0,0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,(ulong)uVar10 * 0x90,pvVar11);
    for (local_10c = 0; local_10c < uVar10 * 9; local_10c = local_10c + 1) {
      pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_b0,(ulong)local_10c);
      tcu::Vector<float,_4>::Vector(&local_11c,pvVar11);
      tcu::Vector<float,_4>::Vector(&local_12c,123.0);
      bVar3 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_11c,&local_12c);
      if (!bVar3) {
        anon_unknown_0::Output("Incorrect data at index %d.\n",(ulong)local_10c);
        this_local._7_1_ = 0;
        goto LAB_00f5ae56;
      }
    }
    this_local._7_1_ = 1;
LAB_00f5ae56:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_b0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		for (int i = 0; i < 9; ++i)
		{
			char name[32];
			sprintf(name, "g_sampler%d", i);
			glUniform1i(glGetUniformLocation(m_program, name), i);
		}
		glUseProgram(0);

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();
		const GLint kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());

		std::vector<vec4> buffer_data(kBufferSize * 9);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 9, &buffer_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		std::vector<vec4> texture_data(kBufferSize, vec4(123.0f));
		if (m_texture[0] == 0)
			glGenTextures(9, m_texture);
		if (m_texture_buffer == 0)
			glGenBuffers(1, &m_texture_buffer);

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_1D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, GL_RGBA32F, kWidth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_3D, m_texture[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE3);
		glBindTexture(GL_TEXTURE_RECTANGLE, m_texture[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE4);
		glBindTexture(GL_TEXTURE_1D_ARRAY, m_texture[4]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE5);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture[5]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT,
					 &texture_data[0]);

		glActiveTexture(GL_TEXTURE6);
		glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer);
		glBufferData(GL_TEXTURE_BUFFER, kBufferSize * sizeof(vec4), &texture_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[6]);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_texture_buffer);

		glActiveTexture(GL_TEXTURE7);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_texture[7]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, kWidth, kHeight, GL_FALSE);

		glActiveTexture(GL_TEXTURE8);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_texture[8]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, GL_RGBA32F, kWidth, kHeight, kDepth, GL_FALSE);

		// clear MS textures
		GLuint fbo;
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[7], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture[8], 0);
		glClearBufferfv(GL_COLOR, 0, &vec4(123.0f)[0]);
		glDeleteFramebuffers(1, &fbo);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 9, &buffer_data[0]);
		for (GLuint index = 0; index < kBufferSize * 9; ++index)
		{
			if (!IsEqual(buffer_data[index], vec4(123.0f)))
			{
				Output("Incorrect data at index %d.\n", index);
				return false;
			}
		}
		return true;
	}